

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<char>::write_int<int,fmt::FormatSpec>
          (BasicWriter<char> *this,int value,FormatSpec spec)

{
  ThousandsSep thousands_sep;
  char code;
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  CharPtr pcVar4;
  ulong uVar5;
  byte *pbVar6;
  lconv *plVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  uint32_t n;
  StringRef SVar11;
  char prefix [4];
  uint uStack_34;
  
  uVar1 = spec._20_4_;
  uVar8 = (ulong)(uint)value;
  prefix[0] = '\0';
  prefix[1] = '\0';
  prefix[2] = '\0';
  prefix[3] = '\0';
  if (value < 0) {
    prefix[0] = '-';
    prefix[1] = '\0';
    prefix[2] = '\0';
    prefix[3] = '\0';
    uVar8 = (ulong)(uint)-value;
LAB_0011afb4:
    uVar9 = 1;
  }
  else {
    uVar9 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      prefix[0] = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        prefix[0] = 0x20;
      }
      prefix[1] = '\0';
      prefix[2] = '\0';
      prefix[3] = '\0';
      goto LAB_0011afb4;
    }
  }
  code = spec.type_;
  n = (uint32_t)uVar8;
  spec._20_4_ = uVar1;
  if (spec.type_ == '\0') {
LAB_0011aff7:
    uVar2 = internal::count_digits(n);
    pcVar4 = prepare_int_buffer<fmt::FormatSpec>(this,uVar2,&spec,prefix,uVar9);
    internal::format_decimal<unsigned_int,char,fmt::internal::NoThousandsSep>(pcVar4 + 1,uVar8,0);
    return;
  }
  if (spec.type_ == 'B') {
LAB_0011b025:
    uVar2 = uVar9;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      prefix[uVar9] = '0';
      uVar2 = uVar9 | 2;
      prefix[(ulong)uVar9 + 1] = spec.type_;
    }
    uVar9 = 0;
    uVar5 = uVar8;
    do {
      uVar9 = uVar9 + 1;
      uVar3 = (uint)uVar5;
      uVar5 = uVar5 >> 1;
    } while (1 < uVar3);
    pbVar6 = (byte *)prepare_int_buffer<fmt::FormatSpec>(this,uVar9,&spec,prefix,uVar2);
    do {
      uVar9 = (uint)uVar8;
      *pbVar6 = (byte)uVar8 & 1 | 0x30;
      pbVar6 = pbVar6 + -1;
      uVar8 = uVar8 >> 1;
    } while (1 < uVar9);
  }
  else {
    if (spec.type_ != 'X') {
      if (spec.type_ == 'b') goto LAB_0011b025;
      if (spec.type_ != 'x') {
        if (spec.type_ == 'n') {
          uVar2 = internal::count_digits(n);
          plVar7 = localeconv();
          SVar11 = internal::thousands_sep<lconv>(plVar7);
          pcVar4 = prepare_int_buffer<fmt::FormatSpec>
                             (this,(int)SVar11.size_ * ((uVar2 - 1) / 3) + uVar2,&spec,prefix,uVar9)
          ;
          thousands_sep._16_8_ = (ulong)uStack_34 << 0x20;
          thousands_sep.sep_ = SVar11;
          internal::format_decimal<unsigned_int,char,fmt::internal::ThousandsSep>
                    (pcVar4 + 1,n,0,thousands_sep);
          return;
        }
        if (spec.type_ == 'o') {
          if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
            uVar5 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
            prefix[uVar5] = '0';
          }
          uVar2 = 0;
          uVar5 = uVar8;
          do {
            uVar2 = uVar2 + 1;
            uVar3 = (uint)uVar5;
            uVar5 = uVar5 >> 3;
          } while (7 < uVar3);
          pbVar6 = (byte *)prepare_int_buffer<fmt::FormatSpec>(this,uVar2,&spec,prefix,uVar9);
          do {
            uVar9 = (uint)uVar8;
            *pbVar6 = (byte)uVar8 & 7 | 0x30;
            pbVar6 = pbVar6 + -1;
            uVar8 = uVar8 >> 3;
          } while (7 < uVar9);
          return;
        }
        if (spec.type_ != 'd') {
          pcVar10 = "char";
          if (((undefined1  [24])spec & (undefined1  [24])0x1000000000) == (undefined1  [24])0x0) {
            pcVar10 = "integer";
          }
          internal::report_unknown_type(code,pcVar10);
        }
        goto LAB_0011aff7;
      }
    }
    uVar2 = uVar9;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      prefix[uVar9] = '0';
      uVar2 = uVar9 | 2;
      prefix[(ulong)uVar9 + 1] = spec.type_;
    }
    uVar9 = 0;
    uVar5 = uVar8;
    do {
      uVar9 = uVar9 + 1;
      uVar3 = (uint)uVar5;
      uVar5 = uVar5 >> 4;
    } while (0xf < uVar3);
    pcVar4 = prepare_int_buffer<fmt::FormatSpec>(this,uVar9,&spec,prefix,uVar2);
    pcVar10 = "0123456789ABCDEF";
    if (spec.type_ == 'x') {
      pcVar10 = "0123456789abcdef";
    }
    do {
      uVar9 = (uint)uVar8;
      *pcVar4 = pcVar10[uVar9 & 0xf];
      pcVar4 = pcVar4 + -1;
      uVar8 = uVar8 >> 4;
    } while (0xf < uVar9);
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type_prefix();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type_prefix();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#if !(defined(ANDROID) || defined(__ANDROID__))
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}